

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

int ship_label_top_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  int bottom;
  Am_Object bottom_obj;
  Am_Object *self_local;
  
  bottom_obj.data = (Am_Object_Data *)self;
  Am_Object::Get_Sibling((Am_Object *)&stack0xffffffffffffffe8,(Am_Slot_Key)self,(ulong)SHIP_BITMAP)
  ;
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)(Am_Object *)&stack0xffffffffffffffe8,0x65);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&stack0xffffffffffffffe8,0x67);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  iVar1 = iVar1 + iVar2 + SP_Label_Offset;
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe8);
  return iVar1;
}

Assistant:

Am_Define_Formula(int, ship_label_top)
{
  Am_Object bottom_obj = self.Get_Sibling(SHIP_BITMAP);
  int bottom = (int)(bottom_obj.Get(Am_TOP)) + (int)(bottom_obj.Get(Am_HEIGHT));
  return (bottom + SP_Label_Offset);
}